

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O1

bool __thiscall
cmWhileFunctionBlocker::ShouldRemove
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *param_2)

{
  cmListFileArgument *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  cmListFileArgument *this_00;
  cmListFileArgument *r;
  
  iVar4 = std::__cxx11::string::compare((char *)lff);
  if (iVar4 == 0) {
    this_00 = (lff->Arguments).
              super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar1 = (lff->Arguments).
             super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_00 == pcVar1) {
      return true;
    }
    r = (this->Args).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
        _M_impl.super__Vector_impl_data._M_start;
    if (((long)pcVar1 - (long)this_00 ==
         (long)(this->Args).
               super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)r) &&
       (bVar2 = cmListFileArgument::operator==(this_00,r), bVar2)) {
      do {
        r = r + 1;
        this_00 = this_00 + 1;
        bVar2 = this_00 == pcVar1;
        if (bVar2) {
          return bVar2;
        }
        bVar3 = cmListFileArgument::operator==(this_00,r);
      } while (bVar3);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool cmWhileFunctionBlocker::ShouldRemove(const cmListFileFunction& lff,
                                          cmMakefile&)
{
  if (lff.Name.Lower == "endwhile") {
    // if the endwhile has arguments, then make sure
    // they match the arguments of the matching while
    if (lff.Arguments.empty() || lff.Arguments == this->Args) {
      return true;
    }
  }
  return false;
}